

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kqueue.c
# Opt level: O2

void libkqueue_init(void)

{
  uint uVar1;
  
  uVar1 = get_fd_limit();
  kqmap = map_new((ulong)uVar1);
  if (kqmap == (map *)0x0) {
    abort();
  }
  filter_init_all();
  pthread_atfork(libkqueue_pre_fork,libkqueue_parent_fork,libkqueue_child_fork);
  atexit(libkqueue_free);
  return;
}

Assistant:

void
libkqueue_init(void)
{
#ifndef NDEBUG
    char *s = getenv("KQUEUE_DEBUG");
    if ((s != NULL) && (strlen(s) > 0) && (*s != '0')) {
        libkqueue_debug = 1;

#ifdef _WIN32
    tracing_mutex_init(&kq_mtx, NULL);
    /* Initialize the Winsock library */
    WSADATA wsaData;
    if (WSAStartup(MAKEWORD(2,2), &wsaData) != 0)
        abort();
#endif

# if defined(_WIN32) && !defined(__GNUC__)
    /* Enable heap surveillance */
    {
        int tmpFlag = _CrtSetDbgFlag( _CRTDBG_REPORT_FLAG );
        tmpFlag |= _CRTDBG_CHECK_ALWAYS_DF;
        _CrtSetDbgFlag(tmpFlag);
    }
# endif /* _WIN32 */
    }
#endif

   kqmap = map_new(get_fd_limit()); // INT_MAX
   if (kqmap == NULL)
       abort();

#ifdef _WIN32
   kq_init_complete = 1;
#endif

   if (kqops.libkqueue_init)
       kqops.libkqueue_init();

   filter_init_all();

   dbg_puts("library initialization complete");

#ifndef _WIN32
   pthread_atfork(libkqueue_pre_fork, libkqueue_parent_fork, libkqueue_child_fork);
#endif

#ifndef NDEBUG
   atexit(libkqueue_debug_ident_clear);
#endif
   atexit(libkqueue_free);
}